

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void Fl_Image::labeltype(Fl_Label *lo,int lx,int ly,int lw,int lh,Fl_Align la)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  
  plVar1 = (long *)lo->value;
  iVar3 = 0;
  iVar2 = 0;
  if (((la & 4) == 0) && (iVar2 = (int)plVar1[1] - lw, (la & 8) == 0)) {
    iVar2 = iVar2 / 2;
  }
  if (((la & 1) == 0) && (iVar3 = *(int *)((long)plVar1 + 0xc) - lh, (la & 2) == 0)) {
    iVar3 = iVar3 / 2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)lo->color);
  (**(code **)(*plVar1 + 0x38))(plVar1,lx,ly,lw,lh,iVar2,iVar3);
  return;
}

Assistant:

void
Fl_Image::labeltype(const Fl_Label *lo,		// I - Label
                    int            lx,		// I - X position
		    int            ly,		// I - Y position
		    int            lw,		// I - Width of label
		    int            lh,		// I - Height of label
		    Fl_Align       la) {	// I - Alignment
  Fl_Image	*img;				// Image pointer
  int		cx, cy;				// Image position

  img = (Fl_Image *)(lo->value);

  if (la & FL_ALIGN_LEFT) cx = 0;
  else if (la & FL_ALIGN_RIGHT) cx = img->w() - lw;
  else cx = (img->w() - lw) / 2;

  if (la & FL_ALIGN_TOP) cy = 0;
  else if (la & FL_ALIGN_BOTTOM) cy = img->h() - lh;
  else cy = (img->h() - lh) / 2;

  fl_color((Fl_Color)lo->color);

  img->draw(lx, ly, lw, lh, cx, cy);
}